

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

void __thiscall mnf::Point::Point(Point *this,Point *other)

{
  Manifold *M;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *expr;
  RefVec local_68;
  ConstRefVec local_40;
  Point *local_18;
  Point *other_local;
  Point *this_local;
  
  local_18 = other;
  other_local = this;
  SubPoint::value(&local_40,&other->super_SubPoint);
  PointMemory::PointMemory(&this->super_PointMemory,&local_40);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_40);
  this->_vptr_Point = (_func_int **)&PTR_format_00391920;
  M = ConstSubPoint::getManifold(&(local_18->super_SubPoint).super_ConstSubPoint);
  expr = &PointMemory::getMem(&this->super_PointMemory)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_68,expr,
             (type *)0x0);
  SubPoint::SubPoint(&this->super_SubPoint,M,&local_68);
  this->_vptr_Point = (_func_int **)&PTR_format_00391920;
  return;
}

Assistant:

Point::Point(const Point& other)
    : PointMemory(other.value()), SubPoint(other.getManifold(), getMem())
{
}